

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_user_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  anon_union_248_5_a113b5f6_for_proto *pp;
  byte *pbVar1;
  connectdata *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  
  pcVar2 = data->conn;
  pp = &pcVar2->proto;
  if (ftpcode == 0x14b) {
    if ((pcVar2->proto).ftpc.state == FTP_USER) {
      pcVar4 = "";
      if (pcVar2->passwd != (char *)0x0) {
        pcVar4 = pcVar2->passwd;
      }
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PASS %s",pcVar4);
      if (CVar3 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_PASS;
        return CURLE_OK;
      }
      return CVar3;
    }
  }
  else {
    if (ftpcode - 200U < 100) {
      CVar3 = ftp_state_loggedin(data);
      return CVar3;
    }
    if (ftpcode == 0x14c) {
      if ((data->set).str[10] == (char *)0x0) {
        Curl_failf(data,"ACCT requested but none available");
        return CURLE_LOGIN_DENIED;
      }
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"ACCT %s");
      if (CVar3 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_ACCT;
        return CURLE_OK;
      }
      return CVar3;
    }
  }
  if (((data->set).str[0xb] != (char *)0x0) && ((*(byte *)((long)&pcVar2->proto + 0xf0) & 1) == 0))
  {
    CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s");
    if (CVar3 == CURLE_OK) {
      pbVar1 = (byte *)((long)&pcVar2->proto + 0xf0);
      *pbVar1 = *pbVar1 | 1;
      (data->conn->proto).ftpc.state = FTP_USER;
      return CURLE_OK;
    }
    return CVar3;
  }
  Curl_failf(data,"Access denied: %03d");
  return CURLE_LOGIN_DENIED;
}

Assistant:

static CURLcode ftp_state_user_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)instate; /* no use for this yet */

  /* some need password anyway, and others just return 2xx ignored */
  if((ftpcode == 331) && (ftpc->state == FTP_USER)) {
    /* 331 Password required for ...
       (the server requires to send the user's password too) */
    result = Curl_pp_sendf(data, &ftpc->pp, "PASS %s",
                           conn->passwd?conn->passwd:"");
    if(!result)
      state(data, FTP_PASS);
  }
  else if(ftpcode/100 == 2) {
    /* 230 User ... logged in.
       (the user logged in with or without password) */
    result = ftp_state_loggedin(data);
  }
  else if(ftpcode == 332) {
    if(data->set.str[STRING_FTP_ACCOUNT]) {
      result = Curl_pp_sendf(data, &ftpc->pp, "ACCT %s",
                             data->set.str[STRING_FTP_ACCOUNT]);
      if(!result)
        state(data, FTP_ACCT);
    }
    else {
      failf(data, "ACCT requested but none available");
      result = CURLE_LOGIN_DENIED;
    }
  }
  else {
    /* All other response codes, like:

    530 User ... access denied
    (the server denies to log the specified user) */

    if(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER] &&
       !ftpc->ftp_trying_alternative) {
      /* Ok, USER failed.  Let's try the supplied command. */
      result =
        Curl_pp_sendf(data, &ftpc->pp, "%s",
                      data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
      if(!result) {
        ftpc->ftp_trying_alternative = TRUE;
        state(data, FTP_USER);
      }
    }
    else {
      failf(data, "Access denied: %03d", ftpcode);
      result = CURLE_LOGIN_DENIED;
    }
  }
  return result;
}